

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::
tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
insert_key_range_internal
          (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this,key_type start_key,size_t count,bool bypass_verifier)

{
  long lVar1;
  ulong uVar2;
  undefined1 *puVar3;
  key_type key;
  long lVar4;
  value_view v;
  
  uVar2 = count + start_key;
  puVar3 = test_values + start_key * 0x10;
  lVar4 = start_key * 0x10 + 0x2268b8;
  while( true ) {
    if (uVar2 <= start_key) break;
    lVar1 = (start_key / 6) * -0x60;
    v._M_extent._M_extent_value = *(size_t *)(lVar4 + lVar1);
    v._M_ptr = *(pointer *)(puVar3 + lVar1);
    insert_internal(this,start_key,v,bypass_verifier);
    start_key = start_key + 1;
    puVar3 = puVar3 + 0x10;
    lVar4 = lVar4 + 0x10;
  }
  return;
}

Assistant:

void insert_key_range_internal(key_type start_key, std::size_t count,
                                 bool bypass_verifier = false) {
    if constexpr (std::is_same_v<key_type, key_view>) {
      // decode to figure out the start key for the loop.
      unodb::key_decoder dec(start_key);
      std::uint64_t start_key_dec;
      dec.decode(start_key_dec);
      unodb::key_encoder enc;
      for (auto key = start_key_dec; key < start_key_dec + count; ++key) {
        insert(enc.reset().encode(key).get_key_view(),
               test_values[key % test_values.size()], bypass_verifier);
      }
    } else {
      for (auto key = start_key; key < start_key + count; ++key) {
        insert(key, test_values[key % test_values.size()], bypass_verifier);
      }
    }
  }